

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

int xcb_input_feedback_ctl_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_ctl_data_t *_aux)

{
  void *__dest;
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  char xcb_pad0 [3];
  iovec xcb_parts [24];
  undefined2 local_1bc;
  undefined1 local_1ba;
  xcb_input_feedback_ctl_data_t *local_1b8;
  ulong local_1b0;
  uint8_t *local_1a8 [3];
  long local_190;
  int8_t *local_188 [2];
  int16_t *local_178;
  undefined8 local_170;
  int16_t *local_168;
  undefined8 local_160;
  uint32_t *local_158;
  undefined8 local_150;
  uint32_t *local_148;
  undefined8 local_140;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_1ba = 0;
  local_1bc = 0;
  memset(&local_1b8,0xaa,0x180);
  iVar4 = 0;
  uVar6 = 0;
  uVar1 = 0;
  if ((int)CONCAT71(in_register_00000031,class_id) == 0) {
    local_1b8 = _aux;
    local_1b0 = 1;
    local_1a8[0] = &(_aux->keyboard).auto_repeat_mode;
    local_1a8[1] = (uint8_t *)0x1;
    local_1a8[2] = (uint8_t *)&(_aux->keyboard).key_click_percent;
    local_190 = 1;
    local_188[0] = &(_aux->keyboard).bell_percent;
    local_188[1] = (int8_t *)0x1;
    local_178 = &(_aux->keyboard).bell_pitch;
    local_170 = 2;
    local_168 = &(_aux->keyboard).bell_duration;
    local_160 = 2;
    local_158 = &(_aux->keyboard).led_mask;
    local_150 = 4;
    local_148 = &(_aux->keyboard).led_values;
    local_140 = 4;
    uVar1 = 0x10;
    uVar6 = 8;
    iVar4 = 4;
  }
  if (class_id == '\x01') {
    uVar7 = (ulong)(uVar6 << 4);
    *(undefined2 **)((long)&local_1b8 + uVar7) = &local_1bc;
    *(undefined8 *)((long)&local_1b0 + uVar7) = 2;
    *(int16_t **)((long)&local_1b8 + (uVar7 | 0x10)) = &(_aux->pointer).num;
    *(undefined8 *)((long)local_1a8 + uVar7 + 8) = 2;
    *(int16_t **)((long)&local_1b8 + (uVar7 | 0x20)) = &(_aux->pointer).denom;
    *(undefined8 *)((long)&local_190 + uVar7) = 2;
    *(int16_t **)((long)&local_1b8 + (uVar7 | 0x30)) = &(_aux->pointer).threshold;
    uVar1 = uVar1 | 8;
    *(undefined8 *)((long)local_188 + uVar7 + 8) = 2;
    uVar6 = uVar6 | 4;
    iVar4 = 2;
  }
  iVar2 = 0;
  if (class_id == '\x02') {
    uVar7 = (ulong)(uVar6 << 4);
    *(undefined2 **)((long)&local_1b8 + uVar7) = &local_1bc;
    *(undefined8 *)((long)&local_1b0 + uVar7) = 2;
    *(uint16_t **)((long)local_1a8 + uVar7) = &(_aux->string).num_keysyms;
    iVar2 = uVar1 + 4;
    *(undefined8 *)((long)local_1a8 + uVar7 + 8) = 2;
    *(xcb_keysym_t **)((long)local_1a8 + uVar7 + 0x10) = (_aux->string).keysyms;
    lVar3 = (ulong)(_aux->string).num_keysyms << 2;
    uVar1 = (uint)lVar3;
    *(long *)((long)&local_190 + uVar7) = lVar3;
    uVar6 = uVar6 + 3;
    iVar4 = 4;
  }
  if (class_id == '\x03') {
    *(anon_struct_4_1_f7b6478c_for_integer **)((long)&local_1b8 + (ulong)(uVar6 << 4)) =
         &_aux->integer;
    uVar1 = uVar1 + 4;
    *(undefined8 *)((long)&local_1b0 + (ulong)(uVar6 << 4)) = 4;
    uVar6 = uVar6 + 1;
    iVar4 = 4;
  }
  if (class_id == '\x04') {
    uVar7 = (ulong)(uVar6 << 4);
    *(anon_struct_8_2_3f0cf693_for_led **)((long)&local_1b8 + uVar7) = &_aux->led;
    *(undefined8 *)((long)&local_1b0 + uVar7) = 4;
    *(uint32_t **)((long)local_1a8 + uVar7) = &(_aux->led).led_values;
    uVar1 = uVar1 + 8;
    *(undefined8 *)((long)local_1a8 + uVar7 + 8) = 4;
    uVar6 = uVar6 + 2;
    iVar4 = 4;
  }
  if (class_id == '\x05') {
    uVar7 = (ulong)(uVar6 << 4);
    *(anon_struct_8_4_64ea3a00_for_bell **)((long)&local_1b8 + uVar7) = &_aux->bell;
    *(undefined8 *)((long)&local_1b0 + uVar7) = 1;
    *(undefined2 **)((long)local_1a8 + uVar7) = &local_1bc;
    *(undefined8 *)((long)local_1a8 + uVar7 + 8) = 3;
    *(int16_t **)((long)local_1a8 + uVar7 + 0x10) = &(_aux->bell).pitch;
    *(undefined8 *)((long)&local_190 + uVar7) = 2;
    *(int16_t **)((long)local_188 + uVar7) = &(_aux->bell).duration;
    uVar1 = uVar1 + 8;
    *(undefined8 *)((long)local_188 + uVar7 + 8) = 2;
    uVar6 = uVar6 + 4;
    iVar4 = 2;
  }
  uVar5 = iVar4 - 1U & -uVar1;
  if (uVar5 != 0) {
    *(undefined2 **)((long)&local_1b8 + (ulong)(uVar6 << 4)) = &local_1bc;
    *(ulong *)((long)&local_1b0 + (ulong)(uVar6 << 4)) = (ulong)uVar5;
    uVar6 = uVar6 + 1;
  }
  uVar5 = iVar2 + uVar1 + uVar5;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar5);
    *_buffer = __dest;
  }
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      if ((*(void **)((long)&local_1b8 + uVar7) != (void *)0x0) &&
         (*(size_t *)((long)&local_1b0 + uVar7) != 0)) {
        memcpy(__dest,*(void **)((long)&local_1b8 + uVar7),*(size_t *)((long)&local_1b0 + uVar7));
      }
      __dest = (void *)((long)__dest + *(long *)((long)&local_1b0 + uVar7));
      uVar7 = uVar7 + 0x10;
    } while (uVar6 << 4 != uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_feedback_ctl_data_serialize (void                                **_buffer,
                                       uint8_t                               class_id,
                                       const xcb_input_feedback_ctl_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[24];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_ctl_data_t.keyboard.key */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key;
        xcb_block_len += sizeof(xcb_input_key_code_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_key_code_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_key_code_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.auto_repeat_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.auto_repeat_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.key_click_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key_click_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_ctl_data_t.pointer.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.pointer.num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.num;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.denom;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_ctl_data_t.string.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_ctl_data_t.integer.int_to_display */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.int_to_display;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_ctl_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_ctl_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}